

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoConvert<float,double>(Thread *this,Ptr *out_trap)

{
  float value;
  double dVar1;
  
  dVar1 = Pop<double>(this);
  if (3.4028234663852886e+38 < ABS(dVar1)) {
    if ((dVar1 <= 3.4028234663852886e+38) || (3.4028235677973366e+38 <= dVar1)) {
      if ((dVar1 <= -3.4028235677973366e+38) || (-3.4028234663852886e+38 <= dVar1)) {
        if (NAN(dVar1)) {
          value = NAN;
        }
        else {
          value = (float)((uint)(float)dVar1 & 0x80000000 | (uint)DAT_00184f80);
        }
      }
      else {
        value = -3.4028235e+38;
      }
    }
    else {
      value = 3.4028235e+38;
    }
  }
  else {
    value = (float)dVar1;
  }
  Push<float>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}